

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O1

example * __thiscall ezexample::get_new_example(ezexample *this)

{
  example *this_00;
  long lVar1;
  
  this_00 = VW::new_unused_example(this->vw_par_ref);
  (*(this->vw_par_ref->p->lp).default_label)(&this_00->l);
  v_array<char>::clear(&this_00->tag);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)this_00);
  lVar1 = 0x20;
  do {
    features::clear((features *)
                    ((long)(this_00->super_example_predict).feature_space + lVar1 + -0x20));
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0x6820);
  (this_00->super_example_predict).ft_offset = 0;
  this_00->passthrough = (features *)0x0;
  this_00->num_features = 0;
  this_00->partial_prediction = 0.0;
  this_00->updated_prediction = 0.0;
  this_00->updated_prediction = 0.0;
  this_00->loss = 0.0;
  this_00->total_sum_feat_sq = 0.0;
  this_00->confidence = 0.0;
  return this_00;
}

Assistant:

example* get_new_example()
  {
    example* new_ec = VW::new_unused_example(*vw_par_ref);
    vw_par_ref->p->lp.default_label(&new_ec->l);
    new_ec->tag.clear();
    new_ec->indices.clear();
    for (size_t i = 0; i < 256; i++) new_ec->feature_space[i].clear();

    new_ec->ft_offset = 0;
    new_ec->num_features = 0;
    new_ec->partial_prediction = 0.;
    new_ec->updated_prediction = 0.;
    new_ec->passthrough = nullptr;
    new_ec->loss = 0.;
    new_ec->total_sum_feat_sq = 0.;
    new_ec->confidence = 0.;
    return new_ec;
  }